

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_key.c
# Opt level: O0

int DH_compute_key(uchar *key,BIGNUM *pub_key,DH *dh)

{
  size_t mask;
  size_t npad;
  int i;
  int ret;
  ulong local_38;
  size_t local_30;
  int local_28;
  int local_4;
  
  local_30 = 0;
  local_38 = 1;
  local_4 = (**(code **)&(dh[1].pub_key)->neg)(key,pub_key,dh);
  if (0 < local_4) {
    for (local_28 = 0; local_28 < local_4; local_28 = local_28 + 1) {
      local_38 = local_38 & (long)(int)(uint)((key[local_28] != '\0' ^ 0xffU) & 1);
      local_30 = local_30 + local_38;
    }
    local_4 = local_4 - (int)local_30;
    memmove(key,key + local_30,(long)local_4);
    memset(key + local_4,0,local_30);
  }
  return local_4;
}

Assistant:

int DH_compute_key(unsigned char *key, const BIGNUM *pub_key, DH *dh)
{
    int ret = 0, i;
    volatile size_t npad = 0, mask = 1;

    /* compute the key; ret is constant unless compute_key is external */
#ifdef FIPS_MODULE
    ret = ossl_dh_compute_key(key, pub_key, dh);
#else
    ret = dh->meth->compute_key(key, pub_key, dh);
#endif
    if (ret <= 0)
        return ret;

    /* count leading zero bytes, yet still touch all bytes */
    for (i = 0; i < ret; i++) {
        mask &= !key[i];
        npad += mask;
    }

    /* unpad key */
    ret -= npad;
    /* key-dependent memory access, potentially leaking npad / ret */
    memmove(key, key + npad, ret);
    /* key-dependent memory access, potentially leaking npad / ret */
    memset(key + ret, 0, npad);

    return ret;
}